

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O3

map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
* __thiscall
LatencyItem::dumpHistogram
          (map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
           *__return_storage_ptr__,LatencyItem *this)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  pair<unsigned_long,_unsigned_long> local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar2 = 0xffffffffffffffff;
  lVar3 = 0x40;
  do {
    if ((this->hist).bins[uVar2 + 1].super___atomic_base<unsigned_long>._M_i != 0) {
      if (lVar3 == -1) {
        return __return_storage_ptr__;
      }
      do {
        local_38.second = (this->hist).bins[uVar2 + 1].super___atomic_base<unsigned_long>._M_i;
        if (local_38.second != 0) {
          local_38.first = 1L << ((byte)lVar3 & 0x3f);
          if (uVar2 == 0xffffffffffffffff) {
            local_38.first = 0xffffffffffffffff;
          }
          std::
          _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
          ::_M_emplace_unique<std::pair<unsigned_long,unsigned_long>>
                    ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                      *)__return_storage_ptr__,&local_38);
        }
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + -1;
      } while (uVar2 < 0x40);
      return __return_storage_ptr__;
    }
    uVar2 = uVar2 + 1;
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar4);
  return __return_storage_ptr__;
}

Assistant:

std::map<double, uint64_t> dumpHistogram() const {
        std::map<double, uint64_t> ret;
        for (auto& entry: hist) {
            HistItr& itr = entry;
            uint64_t cnt = itr.getCount();
            if (cnt) {
                ret.insert( std::make_pair(itr.getUpperBound(), cnt) );
            }
        }
        return ret;
    }